

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnLocalSetExpr(Validator *this,LocalSetExpr *expr)

{
  Var local_70;
  Enum local_24;
  LocalSetExpr *local_20;
  LocalSetExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (LocalSetExpr *)this;
  Var::Var(&local_70,&expr->var);
  local_24 = (Enum)SharedValidator::OnLocalSet
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)25>).super_Expr.loc,&local_70)
  ;
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnLocalSetExpr(LocalSetExpr* expr) {
  result_ |= validator_.OnLocalSet(expr->loc, expr->var);
  return Result::Ok;
}